

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StatisticsTracker::StatisticsTracker
          (StatisticsTracker *this,string *name,long count,double minimum,double mean,double maximum
          ,double variance,StatisticsTrackerOptions *options)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined3 uVar5;
  int iVar6;
  StatisticsTrackerOptions *options_local;
  double variance_local;
  double maximum_local;
  double mean_local;
  double minimum_local;
  long count_local;
  string *name_local;
  StatisticsTracker *this_local;
  
  this->_count = count;
  DynamicHistogram<double>::DynamicHistogram(&this->_histogram,&options->histogramOptions);
  this->_maximum = maximum;
  this->_mean = mean;
  this->_minimum = minimum;
  std::__cxx11::string::string((string *)&this->_name,(string *)name);
  bVar1 = options->doMax;
  bVar2 = options->doMean;
  bVar3 = options->doMin;
  bVar4 = options->doVar;
  uVar5 = *(undefined3 *)&options->field_0x5;
  (this->_options).doCov = options->doCov;
  (this->_options).doMax = bVar1;
  (this->_options).doMean = bVar2;
  (this->_options).doMin = bVar3;
  (this->_options).doVar = bVar4;
  *(undefined3 *)&(this->_options).field_0x5 = uVar5;
  iVar6 = (options->histogramOptions).cacheSize;
  (this->_options).histogramOptions.binCount = (options->histogramOptions).binCount;
  (this->_options).histogramOptions.cacheSize = iVar6;
  uVar5 = *(undefined3 *)&(options->histogramOptions).field_0x9;
  (this->_options).histogramOptions.enabled = (options->histogramOptions).enabled;
  *(undefined3 *)&(this->_options).histogramOptions.field_0x9 = uVar5;
  this->_variance = variance;
  return;
}

Assistant:

StatisticsTracker(std::string name = "",
                      long count = 0,
                      double minimum = 0,
                      double mean = 0,
                      double maximum = 0,
                      double variance = 0,
                      StatisticsTrackerOptions const & options = StatisticsTrackerOptions()) :
        _count(count),
        _histogram(DynamicHistogram<double>(options.histogramOptions)),
        _maximum(maximum),
        _mean(mean),
        _minimum(minimum),
        _name(name),
        _options(options),
        _variance(variance)
    {
    }